

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

bool __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
::
try_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,int>
          (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
           *this,progress_guarantee i_progress_guarantee,int *i_construction_params)

{
  reentrant_put_transaction<Func> tranasction;
  reentrant_put_transaction<Func> local_58;
  reentrant_put_transaction<Func> local_30;
  
  try_start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,int>
            (&local_30,this,i_progress_guarantee,i_construction_params);
  local_58.m_put.m_user_storage = local_30.m_put.m_user_storage;
  local_58.m_put.m_control_block = local_30.m_put.m_control_block;
  local_58.m_put.m_next_ptr = local_30.m_put.m_next_ptr;
  local_58.m_queue = local_30.m_queue;
  if (local_30.m_put.m_user_storage != (void *)0x0) {
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::commit(&local_58);
  }
  if (local_58.m_put.m_user_storage != (void *)0x0) {
    detail::
    LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
    ::cancel_put_impl(&local_58.m_put);
  }
  return local_30.m_put.m_user_storage != (void *)0x0;
}

Assistant:

bool
          try_reentrant_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(
              std::declval<lf_heter_queue>().template try_start_reentrant_emplace<ELEMENT_TYPE>(
                i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)))
        {
            auto tranasction = try_start_reentrant_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }